

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  short sVar1;
  short sVar2;
  Value VVar3;
  Value VVar4;
  Value value;
  undefined2 local_18;
  undefined2 uStack_16;
  undefined2 uStack_14;
  undefined2 uStack_12;
  undefined2 uStack_10;
  undefined2 uStack_e;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  VVar3 = Pop(this);
  VVar4 = Pop(this);
  sVar1 = VVar4.field_0._0_2_;
  sVar2 = VVar4.field_0._2_2_;
  value.field_0.v128_.v[1] = (0 < sVar2) * (sVar2 < 0x100) * VVar4.field_0._2_1_ - (0xff < sVar2);
  value.field_0.v128_.v[0] = (0 < sVar1) * (sVar1 < 0x100) * VVar4.field_0._0_1_ - (0xff < sVar1);
  sVar1 = VVar4.field_0._4_2_;
  value.field_0.v128_.v[2] = (0 < sVar1) * (sVar1 < 0x100) * VVar4.field_0._4_1_ - (0xff < sVar1);
  sVar1 = VVar4.field_0._6_2_;
  value.field_0.v128_.v[3] = (0 < sVar1) * (sVar1 < 0x100) * VVar4.field_0._6_1_ - (0xff < sVar1);
  sVar1 = VVar4.field_0._8_2_;
  value.field_0.v128_.v[4] = (0 < sVar1) * (sVar1 < 0x100) * VVar4.field_0._8_1_ - (0xff < sVar1);
  sVar1 = VVar4.field_0._10_2_;
  value.field_0.v128_.v[5] = (0 < sVar1) * (sVar1 < 0x100) * VVar4.field_0._10_1_ - (0xff < sVar1);
  sVar1 = VVar4.field_0._12_2_;
  value.field_0.v128_.v[6] = (0 < sVar1) * (sVar1 < 0x100) * VVar4.field_0._12_1_ - (0xff < sVar1);
  sVar1 = VVar4.field_0._14_2_;
  value.field_0.v128_.v[7] = (0 < sVar1) * (sVar1 < 0x100) * VVar4.field_0._14_1_ - (0xff < sVar1);
  local_18 = VVar3.field_0._0_2_;
  uStack_16 = VVar3.field_0._2_2_;
  uStack_14 = VVar3.field_0._4_2_;
  uStack_12 = VVar3.field_0._6_2_;
  uStack_10 = VVar3.field_0._8_2_;
  uStack_e = VVar3.field_0._10_2_;
  uStack_c = VVar3.field_0._12_2_;
  uStack_a = VVar3.field_0._14_2_;
  value.field_0.v128_.v[9] =
       (0 < uStack_16) * (uStack_16 < 0x100) * VVar3.field_0._2_1_ - (0xff < uStack_16);
  value.field_0.v128_.v[8] =
       (0 < local_18) * (local_18 < 0x100) * VVar3.field_0._0_1_ - (0xff < local_18);
  value.field_0.v128_.v[10] =
       (0 < uStack_14) * (uStack_14 < 0x100) * VVar3.field_0._4_1_ - (0xff < uStack_14);
  value.field_0.v128_.v[0xb] =
       (0 < uStack_12) * (uStack_12 < 0x100) * VVar3.field_0._6_1_ - (0xff < uStack_12);
  value.field_0.v128_.v[0xc] =
       (0 < uStack_10) * (uStack_10 < 0x100) * VVar3.field_0._8_1_ - (0xff < uStack_10);
  value.field_0.v128_.v[0xd] =
       (0 < uStack_e) * (uStack_e < 0x100) * VVar3.field_0._10_1_ - (0xff < uStack_e);
  value.field_0.v128_.v[0xe] =
       (0 < uStack_c) * (uStack_c < 0x100) * VVar3.field_0._12_1_ - (0xff < uStack_c);
  value.field_0.v128_.v[0xf] =
       (0 < uStack_a) * (uStack_a < 0x100) * VVar3.field_0._14_1_ - (0xff < uStack_a);
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result[i] = Saturate<SL, TL>(lhs[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result[T::lanes + i] = Saturate<SL, TL>(rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}